

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O2

value_type __thiscall
andres::
BinaryViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Minus<short,_int,_int>_>
::operator()(BinaryViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Minus<short,_int,_int>_>
             *this,size_t c0,size_t c1,size_t c2)

{
  reference psVar1;
  reference piVar2;
  
  psVar1 = View<short,false,std::allocator<unsigned_long>>::operator()
                     ((View<short,false,std::allocator<unsigned_long>> *)this->e1_,c0,c1,c2);
  piVar2 = View<int,false,std::allocator<unsigned_long>>::operator()
                     ((View<int,false,std::allocator<unsigned_long>> *)this->e2_,c0,c1,c2);
  return (int)*psVar1 - *piVar2;
}

Assistant:

const value_type operator()(const std::size_t c0, const std::size_t c1, const std::size_t c2) const 
        { return binaryFunctor_(e1_(c0, c1, c2), e2_(c0, c1, c2)); }